

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall args::ArgumentParser::LongSeparator(ArgumentParser *this,string *longseparator_)

{
  ulong uVar1;
  UsageError *this_00;
  bool bVar2;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  undefined1 local_38 [8];
  string errorMessage;
  string *longseparator__local;
  ArgumentParser *this_local;
  
  errorMessage.field_2._8_8_ = longseparator_;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_38,"longseparator can not be set to empty",&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    this_00 = (UsageError *)__cxa_allocate_exception(0x10);
    UsageError::UsageError(this_00,(string *)local_38);
    __cxa_throw(this_00,&UsageError::typeinfo,UsageError::~UsageError);
  }
  std::__cxx11::string::operator=
            ((string *)&this->longseparator,(string *)errorMessage.field_2._8_8_);
  bVar2 = (this->allowJoinedLongValue & 1U) == 0;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70," ",&local_71);
  }
  else {
    std::__cxx11::string::string(local_70,(string *)errorMessage.field_2._8_8_);
  }
  std::__cxx11::string::operator=((string *)&(this->helpParams).longSeparator,local_70);
  std::__cxx11::string::~string(local_70);
  if (bVar2) {
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  return;
}

Assistant:

void LongSeparator(const std::string &longseparator_)
            {
                if (longseparator_.empty())
                {
                    const std::string errorMessage("longseparator can not be set to empty");
#ifdef ARGS_NOEXCEPT
                    error = Error::Usage;
                    errorMsg = errorMessage;
#else
                    throw UsageError(errorMessage);
#endif
                } else
                {
                    this->longseparator = longseparator_;
                    this->helpParams.longSeparator = allowJoinedLongValue ? longseparator_ : " ";
                }
            }